

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::EnumValueDescriptorProto::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  EnumValueDescriptorProto *this;
  string *value;
  EnumValueDescriptorProto **v1;
  EnumValueDescriptorProto **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  Arena *arena_00;
  EnumValueOptions *pEVar4;
  LogMessage local_a8;
  Voidify local_91;
  uint local_90;
  uint32_t cached_has_bits;
  LogMessage local_80;
  Voidify local_69;
  EnumValueDescriptorProto *local_68;
  Nullable<const_char_*> local_60;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  EnumValueDescriptorProto *from;
  EnumValueDescriptorProto *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_28;
  string *local_20;
  EnumValueDescriptorProto *local_18;
  anon_union_32_1_493b367e_for_EnumValueDescriptorProto_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (EnumValueDescriptorProto *)to_msg;
  _this = (EnumValueDescriptorProto *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)protobuf::MessageLite::GetArena(to_msg);
  local_68 = (EnumValueDescriptorProto *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::EnumValueDescriptorProto_const*>(&local_68);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::EnumValueDescriptorProto*>(&from);
  local_60 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::EnumValueDescriptorProto_const*,google::protobuf::EnumValueDescriptorProto*>
                       (v1,v2,"&from != _this");
  if (local_60 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_60);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1bed,failure_msg);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_80);
  }
  local_90 = 0;
  puVar3 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  this = from;
  local_90 = *puVar3;
  if ((local_90 & 7) != 0) {
    if ((local_90 & 1) != 0) {
      local_20 = _internal_name_abi_cxx11_((EnumValueDescriptorProto *)arena);
      local_18 = this;
      local_10 = &this->field_0;
      puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
      value = local_20;
      *puVar3 = *puVar3 | 1;
      arena_00 = protobuf::MessageLite::GetArena((MessageLite *)this);
      internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,value,arena_00);
    }
    if ((local_90 & 2) != 0) {
      if ((arena->impl_).head_._M_b._M_p == (__pointer_type)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1bf7,"from._impl_.options_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      if ((from->field_0)._impl_.options_ == (EnumValueOptions *)0x0) {
        to_msg_local = (MessageLite *)(arena->impl_).head_._M_b._M_p;
        local_28 = absl_log_internal_check_op_result;
        pEVar4 = (EnumValueOptions *)
                 Arena::CopyConstruct<google::protobuf::EnumValueOptions>
                           ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.options_ = pEVar4;
      }
      else {
        EnumValueOptions::MergeFrom
                  ((from->field_0)._impl_.options_,
                   (EnumValueOptions *)(arena->impl_).head_._M_b._M_p);
      }
    }
    if ((local_90 & 4) != 0) {
      (from->field_0)._impl_.number_ = *(int32_t *)&(arena->impl_).first_owner_;
    }
  }
  uVar1 = local_90;
  puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar3 = uVar1 | *puVar3;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void EnumValueDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumValueDescriptorProto*>(&to_msg);
  auto& from = static_cast<const EnumValueDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}